

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::PolyKernel::ByteSizeLong(PolyKernel *this)

{
  int32 iVar1;
  int iVar2;
  size_t sVar3;
  void *in_RDX;
  void *in_RSI;
  double extraout_XMM0_Qa;
  double dVar4;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  PolyKernel *this_local;
  
  sStack_18 = 0;
  c(this,in_RSI,in_RDX);
  if ((extraout_XMM0_Qa != 0.0) || (NAN(extraout_XMM0_Qa))) {
    sStack_18 = 9;
  }
  dVar4 = gamma(this,extraout_XMM0_Qa);
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    sStack_18 = sStack_18 + 9;
  }
  iVar1 = degree(this);
  if (iVar1 != 0) {
    iVar1 = degree(this);
    sVar3 = google::protobuf::internal::WireFormatLite::Int32Size(iVar1);
    sStack_18 = sVar3 + 1 + sStack_18;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar2;
  return sStack_18;
}

Assistant:

size_t PolyKernel::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.PolyKernel)
  size_t total_size = 0;

  // double c = 2;
  if (this->c() != 0) {
    total_size += 1 + 8;
  }

  // double gamma = 3;
  if (this->gamma() != 0) {
    total_size += 1 + 8;
  }

  // int32 degree = 1;
  if (this->degree() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->degree());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}